

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compiler.cpp
# Opt level: O0

bool __thiscall
r_comp::Compiler::indirection
          (Compiler *this,Ptr *node,Class *reference_class,string *path,
          vector<short,_std::allocator<short>_> *indices,ReturnType expected_type)

{
  Metadata *this_00;
  bool bVar1;
  long lVar2;
  pointer ppVar3;
  shared_ptr<r_comp::RepliStruct> local_180;
  string local_170 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_150 [34];
  uint16_t local_12e;
  int local_12c;
  shared_ptr<r_comp::RepliStruct> local_128;
  string local_118 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f8 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d8 [32];
  value_type_conflict local_b8 [3];
  allocator local_b1;
  string local_b0 [32];
  _Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_r_comp::Class>,_true>
  local_90 [3];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_78 [8];
  string name;
  size_t pos;
  Class *pCStack_48;
  ReturnType type;
  Class *fetched_class;
  uint16_t index;
  vector<short,_std::allocator<short>_> *pvStack_38;
  ReturnType expected_type_local;
  vector<short,_std::allocator<short>_> *indices_local;
  string *path_local;
  Class *reference_class_local;
  Ptr *node_local;
  Compiler *this_local;
  
  fetched_class._4_4_ = expected_type;
  pvStack_38 = indices;
  indices_local = (vector<short,_std::allocator<short>_> *)path;
  path_local = (string *)reference_class;
  reference_class_local = (Class *)node;
  node_local = (Ptr *)this;
  do {
    lVar2 = std::__cxx11::string::length();
    if (lVar2 == 0) goto LAB_001956ba;
    lVar2 = std::__cxx11::string::find((char *)path,0x1ca8db);
    std::__cxx11::string::substr((ulong)local_78,(ulong)path);
    bVar1 = std::operator==(local_78,"vw");
    if (bVar1) {
      this_00 = this->_metadata;
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_b0,"pgm_view",&local_b1);
      local_90[0]._M_cur =
           (__node_type *)
           std::
           unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_r_comp::Class,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_r_comp::Class>_>_>
           ::find(&this_00->classes,(key_type *)local_b0);
      ppVar3 = std::__detail::
               _Node_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_r_comp::Class>,_false,_true>
               ::operator->((_Node_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_r_comp::Class>,_false,_true>
                             *)local_90);
      pCStack_48 = &ppVar3->second;
      std::__cxx11::string::~string(local_b0);
      std::allocator<char>::~allocator((allocator<char> *)&local_b1);
      pos._4_4_ = ANY;
      local_b8[2] = 0xffff;
      std::vector<short,_std::allocator<short>_>::push_back(pvStack_38,local_b8 + 2);
LAB_00195555:
      if (lVar2 == -1) {
        local_12c = 3;
      }
      else if (pCStack_48 == (Class *)0x0) {
        std::operator+((char *)local_170,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       " error: ");
        std::operator+(local_150,(char *)local_170);
        std::shared_ptr<r_comp::RepliStruct>::shared_ptr(&local_180,node);
        set_error(this,local_150,&local_180);
        std::shared_ptr<r_comp::RepliStruct>::~shared_ptr(&local_180);
        std::__cxx11::string::~string((string *)local_150);
        std::__cxx11::string::~string(local_170);
        this_local._7_1_ = 0;
        local_12c = 1;
      }
      else {
        path_local = (string *)pCStack_48;
        std::__cxx11::string::erase((ulong)path,0);
        local_12c = 0;
      }
    }
    else {
      bVar1 = std::operator==(local_78,"mks");
      if (bVar1) {
        pCStack_48 = (Class *)0x0;
        pos._4_4_ = SET;
        local_b8[1] = 0xfffe;
        std::vector<short,_std::allocator<short>_>::push_back(pvStack_38,local_b8 + 1);
        goto LAB_00195555;
      }
      bVar1 = std::operator==(local_78,"vws");
      if (bVar1) {
        pCStack_48 = (Class *)0x0;
        pos._4_4_ = SET;
        local_b8[0] = -3;
        std::vector<short,_std::allocator<short>_>::push_back(pvStack_38,local_b8);
        goto LAB_00195555;
      }
      bVar1 = Class::get_member_index
                        ((Class *)path_local,this->_metadata,local_78,
                         (uint16_t *)((long)&fetched_class + 2),&stack0xffffffffffffffb8);
      if (bVar1) {
        pos._4_4_ = Class::get_member_type((Class *)path_local,fetched_class._2_2_);
        local_12e = fetched_class._2_2_;
        std::vector<short,_std::allocator<short>_>::push_back
                  (pvStack_38,(value_type_conflict *)&local_12e);
        goto LAB_00195555;
      }
      std::operator+((char *)local_118,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)" error: "
                    );
      std::operator+(local_f8,(char *)local_118);
      std::operator+(local_d8,local_f8);
      std::shared_ptr<r_comp::RepliStruct>::shared_ptr(&local_128,node);
      set_error(this,local_d8,&local_128);
      std::shared_ptr<r_comp::RepliStruct>::~shared_ptr(&local_128);
      std::__cxx11::string::~string((string *)local_d8);
      std::__cxx11::string::~string((string *)local_f8);
      std::__cxx11::string::~string(local_118);
      this_local._7_1_ = 0;
      local_12c = 1;
    }
    std::__cxx11::string::~string((string *)local_78);
  } while (local_12c == 0);
  if (local_12c != 1) {
LAB_001956ba:
    if ((pos._4_4_ == fetched_class._4_4_) || (fetched_class._4_4_ == ANY)) {
      this_local._7_1_ = 1;
    }
    else {
      this_local._7_1_ = 0;
    }
  }
  return (bool)(this_local._7_1_ & 1);
}

Assistant:

bool Compiler::indirection(RepliStruct::Ptr node, Class *reference_class, std::string path, std::vector<int16_t> *indices, const ReturnType expected_type)
{
    uint16_t index;
    Class *fetched_class;
    ReturnType type;

    while (path.length() > 0) {
        size_t pos = path.find(".");
        std::string name = path.substr(0, pos);

        if (name == "vw") {
            fetched_class = &_metadata->classes.find("pgm_view")->second;
            type = ANY;
            indices->push_back(-1);
        } else if (name == "mks") {
            fetched_class = nullptr;
            type = SET;
            indices->push_back(-2);
        } else if (name == "vws") {
            fetched_class = nullptr;
            type = SET;
            indices->push_back(-3);
        } else if (!reference_class->get_member_index(_metadata, name, index, fetched_class)) {
            set_error(" error: " + name + " is not a member of " + reference_class->str_opcode, node);
            return false;
        } else {
            type = reference_class->get_member_type(index);
            indices->push_back(index);
        }

        // No more dots
        if (pos == std::string::npos) {
            break;
        }

        if (!fetched_class) {
            set_error(" error: " + name + " is not an addressable structure", node);
            return false;
        }

        reference_class = fetched_class;
        path.erase(0, pos + 1); // Remove fetched name + .
    }

    if (type == expected_type || expected_type == ANY) {
        return true;
    } else {
        return false;
    }
}